

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

UBool __thiscall icu_63::PluralFormat::operator==(PluralFormat *this,Format *other)

{
  PluralRules *pPVar1;
  UBool UVar2;
  int iVar3;
  bool local_32;
  bool local_31;
  PluralFormat *o;
  Format *other_local;
  PluralFormat *this_local;
  
  if (this == (PluralFormat *)other) {
    return '\x01';
  }
  UVar2 = Format::operator==(&this->super_Format,other);
  if (UVar2 != '\0') {
    UVar2 = Locale::operator==(&this->locale,(Locale *)(other + 1));
    local_31 = false;
    if (UVar2 != '\0') {
      UVar2 = MessagePattern::operator==
                        (&this->msgPattern,(MessagePattern *)(other[1].validLocale + 0x3b));
      local_31 = false;
      if ((UVar2 != '\0') &&
         (local_31 = false,
         (this->numberFormat == (NumberFormat *)0x0) ==
         (*(long *)(other[2].actualLocale + 0x10) == 0))) {
        if ((this->numberFormat != (NumberFormat *)0x0) &&
           (iVar3 = (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[3])
                              (this->numberFormat,*(undefined8 *)(other[2].actualLocale + 0x10)),
           (char)iVar3 == '\0')) {
          return '\0';
        }
        local_31 = false;
        if (((this->pluralRulesWrapper).pluralRules == (PluralRules *)0x0) ==
            (*(long *)(other[2].actualLocale + 0x28) == 0)) {
          local_32 = true;
          if ((this->pluralRulesWrapper).pluralRules != (PluralRules *)0x0) {
            pPVar1 = (this->pluralRulesWrapper).pluralRules;
            iVar3 = (*(pPVar1->super_UObject)._vptr_UObject[3])
                              (pPVar1,*(undefined8 *)(other[2].actualLocale + 0x28));
            local_32 = (char)iVar3 != '\0';
          }
          local_31 = local_32;
        }
      }
    }
    return local_31;
  }
  return '\0';
}

Assistant:

UBool
PluralFormat::operator==(const Format& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (!Format::operator==(other)) {
        return FALSE;
    }
    const PluralFormat& o = (const PluralFormat&)other;
    return
        locale == o.locale &&
        msgPattern == o.msgPattern &&  // implies same offset
        (numberFormat == NULL) == (o.numberFormat == NULL) &&
        (numberFormat == NULL || *numberFormat == *o.numberFormat) &&
        (pluralRulesWrapper.pluralRules == NULL) == (o.pluralRulesWrapper.pluralRules == NULL) &&
        (pluralRulesWrapper.pluralRules == NULL ||
            *pluralRulesWrapper.pluralRules == *o.pluralRulesWrapper.pluralRules);
}